

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32WaveGenerator::computePositions
          (LA32WaveGenerator *this,Bit32u highLinearLength,Bit32u lowLinearLength,
          Bit32u resonanceWaveLengthFactor)

{
  Bit32u BVar1;
  Bit32u resonanceWaveLengthFactor_local;
  Bit32u lowLinearLength_local;
  Bit32u highLinearLength_local;
  LA32WaveGenerator *this_local;
  
  BVar1 = (this->wavePosition >> 8) * (resonanceWaveLengthFactor >> 4);
  this->resonanceSinePosition = BVar1;
  this->squareWavePosition = BVar1;
  if (this->squareWavePosition < 0x40000) {
    this->phase = POSITIVE_RISING_SINE_SEGMENT;
  }
  else {
    this->squareWavePosition = this->squareWavePosition - 0x40000;
    if (this->squareWavePosition < highLinearLength) {
      this->phase = POSITIVE_LINEAR_SEGMENT;
    }
    else {
      this->squareWavePosition = this->squareWavePosition - highLinearLength;
      if (this->squareWavePosition < 0x40000) {
        this->phase = POSITIVE_FALLING_SINE_SEGMENT;
      }
      else {
        this->squareWavePosition = this->squareWavePosition - 0x40000;
        this->resonanceSinePosition = this->squareWavePosition;
        if (this->squareWavePosition < 0x40000) {
          this->phase = NEGATIVE_FALLING_SINE_SEGMENT;
        }
        else {
          this->squareWavePosition = this->squareWavePosition - 0x40000;
          if (this->squareWavePosition < lowLinearLength) {
            this->phase = NEGATIVE_LINEAR_SEGMENT;
          }
          else {
            this->squareWavePosition = this->squareWavePosition - lowLinearLength;
            this->phase = NEGATIVE_RISING_SINE_SEGMENT;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void LA32WaveGenerator::computePositions(Bit32u highLinearLength, Bit32u lowLinearLength, Bit32u resonanceWaveLengthFactor) {
	// Assuming 12-bit multiplication used here
	squareWavePosition = resonanceSinePosition = (wavePosition >> 8) * (resonanceWaveLengthFactor >> 4);
	if (squareWavePosition < SINE_SEGMENT_RELATIVE_LENGTH) {
		phase = POSITIVE_RISING_SINE_SEGMENT;
		return;
	}
	squareWavePosition -= SINE_SEGMENT_RELATIVE_LENGTH;
	if (squareWavePosition < highLinearLength) {
		phase = POSITIVE_LINEAR_SEGMENT;
		return;
	}
	squareWavePosition -= highLinearLength;
	if (squareWavePosition < SINE_SEGMENT_RELATIVE_LENGTH) {
		phase = POSITIVE_FALLING_SINE_SEGMENT;
		return;
	}
	squareWavePosition -= SINE_SEGMENT_RELATIVE_LENGTH;
	resonanceSinePosition = squareWavePosition;
	if (squareWavePosition < SINE_SEGMENT_RELATIVE_LENGTH) {
		phase = NEGATIVE_FALLING_SINE_SEGMENT;
		return;
	}
	squareWavePosition -= SINE_SEGMENT_RELATIVE_LENGTH;
	if (squareWavePosition < lowLinearLength) {
		phase = NEGATIVE_LINEAR_SEGMENT;
		return;
	}
	squareWavePosition -= lowLinearLength;
	phase = NEGATIVE_RISING_SINE_SEGMENT;
}